

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<std::complex<double>_>::EqnForward
          (TPZEqnArray<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *F,
          DecomposeType dec)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  void *pvVar5;
  int64_t iVar6;
  complex<double> *pcVar7;
  TPZFMatrix<std::complex<double>_> *this_00;
  int in_EDX;
  complex<double> *in_RSI;
  TPZEqnArray<std::complex<double>_> *in_RDI;
  undefined4 uVar8;
  undefined4 uVar9;
  int i_1;
  complex<double> udiag_1;
  int last_term_1;
  int index_1;
  int i;
  complex<double> udiag;
  int last_term;
  int index;
  int j;
  size_t in_stack_00000308;
  char *in_stack_00000310;
  complex<double> *in_stack_fffffffffffffee8;
  complex<double> *in_stack_fffffffffffffef0;
  complex<double> *in_stack_fffffffffffffef8;
  complex<double> *in_stack_ffffffffffffff00;
  complex<double> *in_stack_ffffffffffffff08;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffff10;
  int local_94;
  int local_7c;
  complex<double> local_78;
  int local_64;
  undefined8 local_58;
  int local_4c;
  undefined8 local_48;
  undefined8 local_40;
  int local_34;
  complex<double> local_30;
  int local_1c;
  int local_18;
  int local_14;
  complex<double> *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  iVar2 = IsSymmetric(in_RDI);
  if (iVar2 == 1) {
    for (local_18 = 0; local_18 < in_RDI->fNumEq; local_18 = local_18 + 1) {
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
      local_1c = *piVar3;
      TPZVec<std::complex<double>_>::operator[]
                ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues,(long)local_1c);
      uVar8 = 0;
      uVar9 = 0;
      std::complex<double>::complex(&local_30,0.0,0.0);
      bVar1 = std::operator==(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      if (bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ")
        ;
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
        poVar4 = std::operator<<(poVar4," Equation = ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,local_18);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        pzinternal::DebugStopImpl(in_stack_00000310,in_stack_00000308);
      }
      if (local_18 == in_RDI->fNumEq + -1) {
        iVar6 = TPZVec<std::complex<double>_>::NElements
                          ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues);
        local_34 = (int)iVar6;
      }
      else {
        piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
        local_34 = *piVar3;
      }
      if ((local_14 == 3) || (local_14 == 1)) {
        TPZVec<std::complex<double>_>::operator[]
                  ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues,(long)local_1c);
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
        TPZFMatrix<std::complex<double>_>::operator()
                  (in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08,
                   (int64_t)in_stack_ffffffffffffff00);
        std::complex<double>::operator/=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
      TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
      pcVar7 = TPZFMatrix<std::complex<double>_>::operator()
                         (in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08,
                          (int64_t)in_stack_ffffffffffffff00);
      local_48 = *(undefined8 *)pcVar7->_M_value;
      local_40 = *(undefined8 *)(pcVar7->_M_value + 8);
      local_4c = local_1c;
      while (local_4c = local_4c + 1, local_4c < local_34) {
        TPZVec<std::complex<double>_>::operator[]
                  ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues,(long)local_4c);
        std::operator*(in_stack_fffffffffffffee8,(complex<double> *)0x1d6c077);
        local_58 = CONCAT44(uVar9,uVar8);
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_4c);
        TPZFMatrix<std::complex<double>_>::operator()
                  (in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08,
                   (int64_t)in_stack_ffffffffffffff00);
        std::complex<double>::operator-=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
      if (local_14 == 4) {
        TPZVec<std::complex<double>_>::operator[]
                  ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues,(long)local_1c);
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
        TPZFMatrix<std::complex<double>_>::operator()
                  (in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08,
                   (int64_t)in_stack_ffffffffffffff00);
        std::complex<double>::operator/=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
    }
  }
  else {
    iVar2 = IsSymmetric(in_RDI);
    if (iVar2 == 2) {
      for (local_18 = 1; local_18 < in_RDI->fNumEq; local_18 = local_18 + 2) {
        piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
        local_64 = *piVar3;
        this_00 = (TPZFMatrix<std::complex<double>_> *)
                  TPZVec<std::complex<double>_>::operator[]
                            ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues,(long)local_64);
        std::complex<double>::complex(&local_78,0.0,0.0);
        bVar1 = std::operator==(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "Diagonal Value = 0 >> Aborting on Index = ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_64);
          poVar4 = std::operator<<(poVar4," Equation = ");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,local_18);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
          pzinternal::DebugStopImpl(in_stack_00000310,in_stack_00000308);
        }
        if (local_18 == in_RDI->fNumEq + -1) {
          iVar6 = TPZVec<std::complex<double>_>::NElements
                            ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues);
          local_7c = (int)iVar6;
        }
        else {
          piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
          local_7c = *piVar3;
        }
        if ((local_14 == 3) || (local_14 == 1)) {
          in_stack_ffffffffffffff08 =
               TPZVec<std::complex<double>_>::operator[]
                         ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues,(long)local_64);
          in_stack_ffffffffffffff00 = local_10;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_64);
          TPZFMatrix<std::complex<double>_>::operator()
                    (this_00,(int64_t)in_stack_ffffffffffffff08,(int64_t)in_stack_ffffffffffffff00);
          std::complex<double>::operator/=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        }
        in_stack_fffffffffffffef8 = local_10;
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_64);
        TPZFMatrix<std::complex<double>_>::operator()
                  (this_00,(int64_t)in_stack_ffffffffffffff08,(int64_t)in_stack_ffffffffffffff00);
        local_94 = local_64;
        while (local_94 = local_94 + 1, local_94 < local_7c) {
          TPZVec<std::complex<double>_>::operator[]
                    ((TPZVec<std::complex<double>_> *)&in_RDI->fEqValues,(long)local_94);
          std::operator*(in_stack_fffffffffffffee8,(complex<double> *)0x1d6c3d0);
          pcVar7 = local_10;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_94);
          TPZFMatrix<std::complex<double>_>::operator()
                    (this_00,(int64_t)in_stack_ffffffffffffff08,(int64_t)in_stack_ffffffffffffff00);
          std::complex<double>::operator-=(pcVar7,in_stack_fffffffffffffee8);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}